

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O2

void __thiscall obs::safe_list<Observer>::iterator::lock(iterator *this)

{
  if (this->m_locked == false) {
    if (this->m_node == (node *)0x0) {
      __assert_fail("m_node",
                    "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                    ,0xee,"void obs::safe_list<Observer>::iterator::lock() [T = Observer]");
    }
    node::lock(this->m_node,this);
    this->m_value = this->m_node->value;
    this->m_locked = true;
  }
  return;
}

Assistant:

void lock() {
      if (m_locked)
        return;

      assert(m_node);
      m_node->lock(this);
      m_value = m_node->value;
      m_locked = true;
    }